

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

void __thiscall libDAI::MaxPlus::updateMessage(MaxPlus *this,size_t iI)

{
  double i_00;
  size_t sVar1;
  double *pdVar2;
  size_type in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t i;
  double nd;
  double d;
  Prob *new_message;
  Prob *this_message;
  TProb<double> *in_stack_ffffffffffffff98;
  double i_01;
  TProb<double> *in_stack_ffffffffffffffa0;
  ulong local_38;
  
  if (1e-05 < *(double *)(in_RDI + 0x138)) {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x168),in_RSI);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x180),in_RSI);
    i_00 = *(double *)(in_RDI + 0x138);
    for (local_38 = 0; sVar1 = TProb<double>::size((TProb<double> *)0xbb0c5a), local_38 < sVar1;
        local_38 = local_38 + 1) {
      i_01 = i_00;
      pdVar2 = TProb<double>::operator[](in_stack_ffffffffffffffa0,(size_t)i_00);
      *pdVar2 = i_01 * *pdVar2;
      pdVar2 = TProb<double>::operator[](in_stack_ffffffffffffffa0,(size_t)i_01);
      in_stack_ffffffffffffffa0 = (TProb<double> *)*pdVar2;
      pdVar2 = TProb<double>::operator[](in_stack_ffffffffffffffa0,(size_t)i_01);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_stack_ffffffffffffffa0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = 1.0 - i_00;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *pdVar2;
      auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
      *pdVar2 = auVar3._0_8_;
    }
  }
  else {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x180),in_RSI);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
               (in_RDI + 0x168),in_RSI);
    TProb<double>::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void MaxPlus::updateMessage(size_t iI) {
        if( Props.damping <= 0.00001 )
        {
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - No damping" << endl;
#endif            
            _messages[iI] = _newmessages[iI];
        }
        else
        {
            //this does not work correctly for arbitrary numbers
            //_messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            //rather use regular pointwise multiplication
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - using damping, damp factor=" << 
                Props.damping<<"..."<<endl;
            cout << "old messages     " << _messages[iI] << endl;
            cout << "new messages     " << _newmessages[iI] << endl;            
#endif            
            //inlined this code to speed it up (no need to create new 
            //vectors etc.)
            //_messages[iI] = (_messages[iI] * Props.damping) + (_newmessages[iI] * (1.0 - Props.damping));
            Prob & this_message = _messages[iI];
            Prob & new_message = _newmessages[iI];
            double d = Props.damping;
            double nd = 1.0 - d;
            for(size_t i=0; i < this_message.size(); i++)
            {
                this_message[i] *= d;
                this_message[i] += nd * new_message[i];
            }
                 

#if DEBUG_DAMP
            cout << "updated messages " << _messages[iI] << endl;            
#endif            
        }
    }